

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdtls.cpp
# Opt level: O0

void __thiscall QDtlsClientVerifier::QDtlsClientVerifier(QDtlsClientVerifier *this,QObject *parent)

{
  QObjectPrivate *this_00;
  pointer pDVar1;
  QObject *in_RSI;
  QObject *in_RDI;
  long in_FS_OFFSET;
  DtlsCookieVerifier *backend;
  QDtlsClientVerifierPrivate *d;
  QSslConfiguration conf;
  PeerVerifyMode in_stack_ffffffffffffffbc;
  QDtlsClientVerifierPrivate *in_stack_ffffffffffffffd8;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QObjectPrivate *)operator_new(0x80);
  QDtlsClientVerifierPrivate::QDtlsClientVerifierPrivate(in_stack_ffffffffffffffd8);
  QObject::QObject(in_RDI,this_00,in_RSI);
  *(undefined ***)in_RDI = &PTR_metaObject_004a0c30;
  d_func((QDtlsClientVerifier *)0x3b915d);
  pDVar1 = std::
           unique_ptr<QTlsPrivate::DtlsCookieVerifier,_std::default_delete<QTlsPrivate::DtlsCookieVerifier>_>
           ::get((unique_ptr<QTlsPrivate::DtlsCookieVerifier,_std::default_delete<QTlsPrivate::DtlsCookieVerifier>_>
                  *)0x3b9170);
  if (pDVar1 != (pointer)0x0) {
    local_10 = 0xaaaaaaaaaaaaaaaa;
    QSslConfiguration::defaultDtlsConfiguration();
    QSslConfiguration::setPeerVerifyMode((QSslConfiguration *)this_00,in_stack_ffffffffffffffbc);
    (**(code **)(*(long *)(pDVar1 + *(long *)(*(long *)pDVar1 + -0x60)) + 0x30))
              (pDVar1 + *(long *)(*(long *)pDVar1 + -0x60),&local_10);
    QSslConfiguration::~QSslConfiguration((QSslConfiguration *)0x3b91c7);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QDtlsClientVerifier::QDtlsClientVerifier(QObject *parent)
    : QObject(*new QDtlsClientVerifierPrivate, parent)
{
    Q_D(QDtlsClientVerifier);

    if (auto *backend = d->backend.get()) {
        // The default configuration suffices: verifier never does a full
        // handshake and upon verifying a cookie in a client hello message,
        // it reports success.
        auto conf = QSslConfiguration::defaultDtlsConfiguration();
        conf.setPeerVerifyMode(QSslSocket::VerifyNone);
        backend->setConfiguration(conf);
    }
}